

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
Lodtalk::AST::MethodAST::MethodAST
          (MethodAST *this,VMContext *context,MethodHeader *header,PragmaList *pragmaList,
          SequenceNode *body)

{
  SequenceNode *body_local;
  PragmaList *pragmaList_local;
  MethodHeader *header_local;
  VMContext *context_local;
  MethodAST *this_local;
  
  FunctionalNode::FunctionalNode(&this->super_FunctionalNode);
  (this->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)&PTR__MethodAST_0020ce40;
  this->context = context;
  this->header = header;
  this->pragmaList = pragmaList;
  this->body = body;
  Ref<Lodtalk::MethodASTHandle>::Ref(&this->astHandle,context);
  return;
}

Assistant:

MethodAST::MethodAST(VMContext *context, MethodHeader *header, PragmaList *pragmaList, SequenceNode *body)
	: context(context), header(header), pragmaList(pragmaList), body(body), astHandle(context)
{
}